

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-rst.c
# Opt level: O2

int run_test_tcp_rst(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in server_addr;
  
  qbuf.base = "QSH";
  qbuf.len = 3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&server_addr);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&tcp);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_tcp_connect(&connect_req,&tcp,(sockaddr *)&server_addr,connect_cb);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        puVar2 = uv_default_loop();
        uv_run(puVar2,UV_RUN_DEFAULT);
        eval_a = 1;
        eval_b = (int64_t)called_alloc_cb;
        if (eval_b == 1) {
          eval_a = 1;
          eval_b = (int64_t)called_connect_cb;
          if (eval_b == 1) {
            eval_a = 1;
            eval_b = (int64_t)called_close_cb;
            if (eval_b == 1) {
              puVar2 = uv_default_loop();
              uv_walk(puVar2,close_walk_cb,(void *)0x0);
              uv_run(puVar2,UV_RUN_DEFAULT);
              eval_a = 0;
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              eval_b = (int64_t)iVar1;
              if (eval_b == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar4 = "uv_loop_close(uv_default_loop())";
              pcVar3 = "0";
              uVar5 = 0x69;
            }
            else {
              pcVar4 = "called_close_cb";
              pcVar3 = "1";
              uVar5 = 0x67;
            }
          }
          else {
            pcVar4 = "called_connect_cb";
            pcVar3 = "1";
            uVar5 = 0x66;
          }
        }
        else {
          pcVar4 = "called_alloc_cb";
          pcVar3 = "1";
          uVar5 = 0x65;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar5 = 0x61;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar5 = 0x5b;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &server_addr)";
    uVar5 = 0x59;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-rst.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(tcp_rst) {
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif
#ifndef _WIN32
  struct sockaddr_in server_addr;
  int r;

  qbuf.base = "QSH";
  qbuf.len = 3;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));
  r = uv_tcp_init(uv_default_loop(), &tcp);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &tcp,
                     (const struct sockaddr*) &server_addr,
                     connect_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, called_alloc_cb);
  ASSERT_EQ(1, called_connect_cb);
  ASSERT_EQ(1, called_close_cb);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}